

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIFont::~CGUIFont(CGUIFont *this)

{
  long lVar1;
  
  lVar1 = *(long *)(*(long *)this + -0x18);
  ~CGUIFont((CGUIFont *)(&this->field_0x0 + lVar1),&VTT);
  operator_delete((CGUIFont *)(&this->field_0x0 + lVar1),0xb8);
  return;
}

Assistant:

CGUIFont::~CGUIFont()
{
	if (Driver)
		Driver->drop();

	if (SpriteBank) {
		SpriteBank->drop();
		// TODO: spritebank still exists in gui-environment and should be removed here when it's
		// reference-count is 1. Just can't do that from here at the moment.
		// But spritebank would not be able to drop textures anyway because those are in texture-cache
		// where they can't be removed unless materials start reference-couting 'em.
	}
}